

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
Parser::parseMetadata(Parser *this,QString *data,qsizetype offset,QStringList *includes)

{
  QStringView *this_00;
  storage_type_conflict *psVar1;
  QArrayData *data_00;
  char16_t *pcVar2;
  Function *data_01;
  undefined8 uVar3;
  undefined8 uVar4;
  Data *pDVar5;
  QString *pQVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  qsizetype qVar15;
  QList<QString> *this_01;
  qsizetype qVar16;
  qsizetype qVar17;
  qlonglong qVar18;
  iterator iVar19;
  iterator iVar20;
  pointer pQVar21;
  iterator iVar22;
  long lVar23;
  QString *str;
  QString *str_00;
  iterator iVar24;
  QString *pQVar25;
  QArrayDataPointer<QString> *this_02;
  qsizetype in_R8;
  const_iterator __begin1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar27;
  long lVar28;
  iterator __i;
  EnumNameValue *pEVar29;
  long in_FS_OFFSET;
  QStringView lhs;
  QStringView lhs_00;
  QStringView string;
  QStringView string_00;
  QStringView lhs_01;
  QStringView lhs_02;
  QStringView lhs_03;
  QStringView lhs_04;
  QStringView lhs_05;
  QStringView lhs_06;
  QStringView lhs_07;
  QStringView lhs_08;
  QStringView lhs_09;
  QStringView lhs_10;
  QStringView lhs_11;
  QStringView lhs_12;
  QStringView lhs_13;
  QStringView lhs_14;
  QStringView lhs_15;
  QStringView rhs;
  QStringView rhs_00;
  QStringView rhs_01;
  QStringView rhs_02;
  QStringView rhs_03;
  QStringView rhs_04;
  QStringView rhs_05;
  QStringView rhs_06;
  QStringView rhs_07;
  QStringView rhs_08;
  QStringView rhs_09;
  QStringView rhs_10;
  QStringView rhs_11;
  QStringView rhs_12;
  QStringView rhs_13;
  QStringView rhs_14;
  QStringView rhs_15;
  QStringView str_01;
  QAnyStringView a;
  QAnyStringView a_00;
  QAnyStringView a_01;
  QAnyStringView a_02;
  QAnyStringView a_03;
  QStringView str_02;
  QRegularExpressionMatch rm;
  QRegularExpressionMatch match;
  QRegularExpressionMatchIterator i;
  QRegularExpression macro;
  QRegularExpressionMatchIterator r;
  QRegularExpression rangeMacro;
  ulong local_280;
  QString local_248 [3];
  QString local_200;
  QArrayDataPointer<EnumNameValue> local_1e8;
  QArrayDataPointer<QString> local_1c8;
  QString local_1a8;
  QString local_188;
  QArrayDataPointer<QString> local_168;
  QString local_148;
  undefined1 local_130 [152];
  QArrayDataPointer<QString> local_98;
  undefined1 local_78 [64];
  long local_38;
  Parser *pPVar26;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._0_8_ = (data->d).ptr;
  local_78._8_8_ = (data->d).size;
  uVar13 = QStringView::indexOf((QStringView *)local_78,(QChar)0x28,offset,CaseSensitive);
  local_78._0_8_ = (data->d).ptr;
  local_78._8_8_ = (data->d).size;
  uVar14 = QStringView::indexOf((QStringView *)local_78,(QChar)0x2c,uVar13,CaseSensitive);
  local_130._88_8_ = (Function *)0x0;
  local_130._96_8_ = (Parser *)0x0;
  local_130._104_8_ = (QString *)0x0;
  local_130._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_130._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_130._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QString::mid((QString *)local_78,data,uVar13 + 1,~uVar13 + uVar14);
  QString::simplified_helper((QString *)(local_130 + 0x38),(QString *)local_78,str);
  if ((Function *)local_78._0_8_ != (Function *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_78._0_8_)->d).d = *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  if (((Data *)local_130._72_8_ == (Data *)(this->m_provider).d.size) &&
     (lhs.m_size = (qsizetype)(this->m_provider).d.ptr,
     lhs.m_data = (storage_type_conflict *)local_130._72_8_, rhs.m_size = in_R8,
     rhs.m_data = (storage_type_conflict *)local_130._72_8_,
     bVar9 = QtPrivate::equalStrings((QtPrivate *)local_130._64_8_,lhs,rhs), bVar9)) {
    local_78._0_8_ = (data->d).ptr;
    local_78._8_8_ = (data->d).size;
    qVar15 = QStringView::indexOf((QStringView *)local_78,(QChar)0x29,uVar14 + 1,CaseSensitive);
    QString::mid((QString *)(local_130 + 0x98),data,uVar14 + 1,~uVar14 + qVar15);
    QString::simplified_helper((QString *)local_78,(QString *)(local_130 + 0x98),str_00);
    uVar8 = local_78._16_8_;
    uVar7 = local_78._0_8_;
    uVar4 = local_130._96_8_;
    uVar3 = local_130._88_8_;
    local_78._0_8_ = local_130._88_8_;
    local_130._88_8_ = uVar7;
    local_130._96_8_ = local_78._8_8_;
    local_78._8_8_ = uVar4;
    local_78._16_8_ = local_130._104_8_;
    local_130._104_8_ = uVar8;
    if ((Function *)uVar3 != (Function *)0x0) {
      LOCK();
      *(int *)&(((QString *)uVar3)->d).d = *(int *)&(((QString *)uVar3)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)uVar3)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)uVar3,2,0x10);
      }
    }
    if ((Function *)local_98.d != (Function *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
      }
    }
    local_130._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_130._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_130._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    preprocessMetadata((QString *)(local_130 + 0x18),(QString *)(local_130 + 0x58));
    local_130._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = (Function *)0x0;
    local_78._8_8_ = L"([A-Z]*) ?{ ?([A-Za-z0-9=_,. ]*) ?} ?([A-Za-z0-9_:]*) ?;";
    local_78._16_8_ = (QString *)0x38;
    QRegularExpression::QRegularExpression
              ((QRegularExpression *)(local_130 + 0x10),(QString *)local_78,(PatternOptions)0x0);
    if ((Function *)local_78._0_8_ != (Function *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_78._0_8_)->d).d = *(int *)&(((QString *)local_78._0_8_)->d).d + -1
      ;
      UNLOCK();
      if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    local_130._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    lVar28 = 0;
    qVar15 = 0;
    QRegularExpression::globalMatch
              ((QRegularExpression *)(local_130 + 8),(QString *)(local_130 + 0x10),
               (qsizetype)(local_130 + 0x18),NormalMatch,(MatchOptions)0x0);
    bVar9 = QRegularExpressionMatchIterator::hasNext
                      ((QRegularExpressionMatchIterator *)(local_130 + 8));
    if (bVar9) {
      this_01 = &this->m_metadata;
      lVar28 = 0;
      do {
        this_02 = (QArrayDataPointer<QString> *)(local_130 + 0x98);
        local_130._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)local_130);
        local_148.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_148.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_148.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QRegularExpressionMatch::captured
                  ((QString *)local_78,(QRegularExpressionMatch *)local_130,2);
        QString::trimmed_helper(&local_148,(QString *)local_78);
        if ((Function *)local_78._0_8_ != (Function *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_78._0_8_)->d).d =
               *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
          }
        }
        qVar16 = QRegularExpressionMatch::capturedStart((QRegularExpressionMatch *)local_130,0);
        lVar23 = (int)qVar16 - lVar28;
        pQVar25 = (QString *)(local_130 + 0x78);
        if (lVar23 != 0 && lVar28 <= (int)qVar16) {
          QString::mid((QString *)local_78,(QString *)(local_130 + 0x18),lVar28,lVar23);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)this_01,(this->m_metadata).d.size,
                     (QString *)local_78);
          QList<QString>::end(this_01);
          if ((Function *)local_78._0_8_ != (Function *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_78._0_8_)->d).d =
                 *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
            }
          }
        }
        qVar16 = QRegularExpressionMatch::capturedEnd((QRegularExpressionMatch *)local_130,0);
        if ((undefined1 *)local_148.d.size == (undefined1 *)0x0) {
LAB_00109b73:
          QString::replace(&local_148,(QChar)0xa,(QChar)0x20,CaseSensitive);
          local_168.size = 0;
          local_168.d = (Data *)0x0;
          local_168.ptr = (QString *)0x0;
          local_78._0_8_ = (Function *)0x0;
          local_78._8_8_ = L"RANGE";
          local_78._16_8_ = (QString *)0x5;
          qVar17 = QString::indexOf(&local_148,(QString *)local_78,0,CaseSensitive);
          if ((Function *)local_78._0_8_ != (Function *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_78._0_8_)->d).d =
                 *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
            }
          }
          if (qVar17 != -1) {
            local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_78._0_8_ = (Function *)0x0;
            local_78._8_8_ = L"RANGE +([A-Za-z0-9_]*) +... +([A-Za-z0-9_]*)";
            local_78._16_8_ = (QString *)0x2c;
            QRegularExpression::QRegularExpression
                      ((QRegularExpression *)this_02,(QString *)local_78,(PatternOptions)0x0);
            if ((Function *)local_78._0_8_ != (Function *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_78._0_8_)->d).d =
                   *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
              }
            }
            local_130._120_8_ = &DAT_aaaaaaaaaaaaaaaa;
            qVar15 = 0;
            QRegularExpression::globalMatch
                      ((QRegularExpression *)pQVar25,(QString *)this_02,(qsizetype)&local_148,
                       NormalMatch,(MatchOptions)0x0);
            while (bVar9 = QRegularExpressionMatchIterator::hasNext
                                     ((QRegularExpressionMatchIterator *)pQVar25), bVar9) {
              local_188.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&local_188);
              QRegularExpressionMatch::captured
                        ((QString *)local_78,(QRegularExpressionMatch *)&local_188,1);
              QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                        ((QMovableArrayOps<QString> *)&local_168,local_168.size,(QString *)local_78)
              ;
              QList<QString>::end((QList<QString> *)&local_168);
              if ((Function *)local_78._0_8_ != (Function *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_78._0_8_)->d).d =
                     *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
                }
              }
              QRegularExpressionMatch::captured
                        ((QString *)local_78,(QRegularExpressionMatch *)&local_188,2);
              QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                        ((QMovableArrayOps<QString> *)&local_168,local_168.size,(QString *)local_78)
              ;
              QList<QString>::end((QList<QString> *)&local_168);
              if ((Function *)local_78._0_8_ != (Function *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_78._0_8_)->d).d =
                     *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
                }
              }
              QRegularExpressionMatch::~QRegularExpressionMatch
                        ((QRegularExpressionMatch *)&local_188);
            }
            QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                      ((QRegularExpressionMatchIterator *)pQVar25);
            QRegularExpression::~QRegularExpression((QRegularExpression *)this_02);
          }
          local_188.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_188.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_188.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          pPVar26 = (Parser *)local_130;
          QRegularExpressionMatch::captured(&local_188,(QRegularExpressionMatch *)pPVar26,1);
          local_1a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_1a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_1a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QRegularExpressionMatch::captured(&local_1a8,(QRegularExpressionMatch *)pPVar26,3);
          if ((undefined1 *)local_188.d.size == (undefined1 *)0x5) {
            lhs_00.m_size = (qsizetype)L"FLAGS";
            lhs_00.m_data = (storage_type_conflict *)0x5;
            pPVar26 = (Parser *)0x5;
            rhs_00.m_size = qVar15;
            rhs_00.m_data = (storage_type_conflict *)0x5;
            bVar9 = QtPrivate::equalStrings((QtPrivate *)local_188.d.ptr,lhs_00,rhs_00);
          }
          else {
            bVar9 = false;
          }
          local_1c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_1c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_1c8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
          findEnumValues((QStringList *)&local_1c8,pPVar26,&local_1a8,includes);
          if ((QString *)local_1c8.size == (QString *)0x0) {
            if (bVar9 != false) {
              aVar27 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)0x73;
              bVar10 = QString::endsWith(&local_1a8,(QChar)0x73,CaseSensitive);
              if (bVar10) {
                if ((undefined1 *)local_1a8.d.size == (undefined1 *)0x0) {
                  local_130._120_8_ = local_1a8.d.d;
                  local_130._128_8_ = local_1a8.d.ptr;
                  local_130._136_8_ = (QString *)0x0;
                  if ((Function *)local_1a8.d.d != (Function *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_1a8.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_1a8.d.d)->super_QArrayData)->d).d + 1;
                    UNLOCK();
                  }
                }
                else {
                  aVar27.m_data_utf16 = local_1a8.d.ptr;
                  QString::QString(pQVar25,(QChar *)local_1a8.d.ptr,
                                   (qsizetype)(local_1a8.d.size + -1));
                }
                findEnumValues((QStringList *)this_02,(Parser *)aVar27.m_data,pQVar25,includes);
                qVar17 = local_98.size;
                pQVar25 = local_98.ptr;
                pDVar5 = local_98.d;
                local_78._16_8_ = local_1c8.size;
                local_78._8_8_ = local_1c8.ptr;
                local_78._0_8_ = local_1c8.d;
                local_98.size = 0;
                local_98.d = (Data *)0x0;
                local_98.ptr = (QString *)0x0;
                local_1c8.d = pDVar5;
                local_1c8.ptr = pQVar25;
                local_1c8.size = qVar17;
                QArrayDataPointer<QString>::~QArrayDataPointer
                          ((QArrayDataPointer<QString> *)local_78);
                QArrayDataPointer<QString>::~QArrayDataPointer(this_02);
                if ((Function *)local_130._120_8_ != (Function *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_130._120_8_)->d).d =
                       *(int *)&(((QString *)local_130._120_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_130._120_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_130._120_8_,2,0x10);
                  }
                }
              }
              if ((QString *)local_1c8.size != (QString *)0x0) goto LAB_00109e78;
            }
          }
          else {
LAB_00109e78:
            local_1e8.d = (Data *)0x0;
            local_1e8.ptr = (EnumNameValue *)0x0;
            local_1e8.size = 0;
            pPVar26 = (Parser *)((long)local_1c8.ptr + local_1c8.size * 0x18);
            iVar11 = 0;
            aVar27 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)local_1c8.ptr;
            do {
              pQVar25 = (QString *)(local_130 + 0x78);
              local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_78._0_8_ = (Function *)0x0;
              local_78._8_8_ = (Parser *)0x0;
              local_78._16_8_ = (QString *)0x0;
              local_78._24_8_ = (QArrayData *)0x0;
              local_78._32_8_ = (char16_t *)0x0;
              local_78._40_8_ = 0;
              local_98.d = *(Data **)((long)aVar27.m_data + 8);
              local_98.ptr = *(QString **)((long)aVar27.m_data + 0x10);
              this_00 = (QStringView *)(local_130 + 0x98);
              qVar17 = QStringView::indexOf(this_00,(QChar)0x3d,0,CaseSensitive);
              if (qVar17 == -1) {
                bVar10 = QString::endsWith((QString *)aVar27.m_data,(QChar)0x2c,CaseSensitive);
                if (bVar10) {
                  QString::left((QString *)this_00,(QString *)aVar27.m_data,
                                *(qsizetype *)((long)aVar27.m_data + 0x10) + -1);
                  uVar4 = local_78._8_8_;
                  uVar3 = local_78._0_8_;
                  qVar17 = local_98.size;
                  pDVar5 = local_98.d;
                  local_98.d = (Data *)local_78._0_8_;
                  local_78._0_8_ = pDVar5;
                  local_78._8_8_ = local_98.ptr;
                  local_98.ptr = (QString *)uVar4;
                  local_98.size = local_78._16_8_;
                  local_78._16_8_ = qVar17;
                  if ((Function *)uVar3 != (Function *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)uVar3)->d).d = *(int *)&(((QString *)uVar3)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)uVar3)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)uVar3,2,0x10);
                    }
                  }
                }
                else {
                  QString::operator=((QString *)local_78,(QString *)aVar27.m_data);
                }
                iVar11 = iVar11 + 1;
                local_78._48_4_ = iVar11;
                QtPrivate::QGenericArrayOps<EnumNameValue>::emplace<EnumNameValue_const&>
                          ((QGenericArrayOps<EnumNameValue> *)&local_1e8,local_1e8.size,
                           (EnumNameValue *)local_78);
                QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1e8);
              }
              else {
                local_98.d = *(Data **)((long)aVar27.m_data + 8);
                local_98.ptr = *(QString **)((long)aVar27.m_data + 0x10);
                uVar13 = QStringView::indexOf(this_00,(QChar)0x3d,0,CaseSensitive);
                QString::left(pQVar25,(QString *)aVar27.m_data,uVar13);
                QString::trimmed_helper((QString *)this_00,pQVar25);
                uVar4 = local_78._8_8_;
                uVar3 = local_78._0_8_;
                qVar17 = local_98.size;
                pDVar5 = local_98.d;
                local_98.d = (Data *)local_78._0_8_;
                local_78._0_8_ = pDVar5;
                local_78._8_8_ = local_98.ptr;
                local_98.ptr = (QString *)uVar4;
                local_98.size = local_78._16_8_;
                local_78._16_8_ = qVar17;
                if ((Function *)uVar3 != (Function *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)uVar3)->d).d = *(int *)&(((QString *)uVar3)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)uVar3)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)uVar3,2,0x10);
                  }
                }
                if ((Function *)local_130._120_8_ != (Function *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_130._120_8_)->d).d =
                       *(int *)&(((QString *)local_130._120_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_130._120_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_130._120_8_,2,0x10);
                  }
                }
                local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
                QString::right(pQVar25,(QString *)aVar27.m_data,
                               ~uVar13 + *(qsizetype *)((long)aVar27.m_data + 0x10));
                QString::trimmed_helper((QString *)this_00,pQVar25);
                if ((Function *)local_130._120_8_ != (Function *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_130._120_8_)->d).d =
                       *(int *)&(((QString *)local_130._120_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_130._120_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_130._120_8_,2,0x10);
                  }
                }
                bVar10 = QString::endsWith((QString *)this_00,(QChar)0x2c,CaseSensitive);
                if (bVar10) {
                  if ((QString *)local_98.size == (QString *)0x0) {
                    local_130._120_8_ = local_98.d;
                    local_130._128_8_ = local_98.ptr;
                    local_130._136_8_ = (QString *)0x0;
                    if ((Function *)local_98.d != (Function *)0x0) {
                      LOCK();
                      *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d =
                           *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d + 1;
                      UNLOCK();
                    }
                  }
                  else {
                    QString::QString(pQVar25,(QChar *)local_98.ptr,
                                     (qsizetype)
                                     ((long)&(((QString *)(local_98.size + -0x18))->d).size + 7));
                  }
                  pQVar6 = local_98.ptr;
                  pDVar5 = local_98.d;
                  uVar4 = local_130._136_8_;
                  uVar3 = local_130._120_8_;
                  local_130._120_8_ = local_98.d;
                  local_98.d = (Data *)uVar3;
                  local_98.ptr = (QString *)local_130._128_8_;
                  local_130._128_8_ = pQVar6;
                  local_130._136_8_ = local_98.size;
                  local_98.size = uVar4;
                  if ((Function *)pDVar5 != (Function *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&pDVar5->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&pDVar5->super_QArrayData)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&pDVar5->super_QArrayData)->d).d == 0) {
                      QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
                    }
                  }
                }
                local_130._120_8_ = local_130._120_8_ & 0xffffffffffffff00;
                string.m_size = (qsizetype)pQVar25;
                string.m_data = (storage_type_conflict *)local_98.size;
                qVar18 = QString::toIntegral_helper(local_98.ptr,string,(bool *)0xa,(int)qVar15);
                if ((int)qVar18 == qVar18) {
                  if ((local_130._120_8_ & 1) == 0) goto LAB_0010a221;
LAB_0010a24d:
                  iVar12 = (int)qVar18;
                  if ((local_130[0x78] & 1) == 0) goto LAB_0010a25f;
LAB_0010a46e:
                  local_78._48_4_ = iVar12;
                  QtPrivate::QGenericArrayOps<EnumNameValue>::emplace<EnumNameValue_const&>
                            ((QGenericArrayOps<EnumNameValue> *)&local_1e8,local_1e8.size,
                             (EnumNameValue *)local_78);
                  QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1e8);
                  iVar11 = iVar12;
                }
                else {
                  local_130._120_8_ = local_130._120_8_ & 0xffffffffffffff00;
LAB_0010a221:
                  string_00.m_size = (qsizetype)pQVar25;
                  string_00.m_data = (storage_type_conflict *)local_98.size;
                  qVar18 = QString::toIntegral_helper
                                     (local_98.ptr,string_00,(bool *)0x10,(int)qVar15);
                  if ((int)qVar18 == qVar18) {
                    goto LAB_0010a24d;
                  }
                  local_130._120_8_ = local_130._120_8_ & 0xffffffffffffff00;
LAB_0010a25f:
                  iVar19 = QList<EnumNameValue>::begin((QList<EnumNameValue> *)&local_1e8);
                  iVar20 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1e8);
                  qVar17 = local_98.size;
                  pQVar25 = local_98.ptr;
                  lVar23 = (long)iVar20.i - (long)iVar19.i;
                  lVar28 = (lVar23 >> 3) * 0x6db6db6db6db6db7 >> 2;
                  if (0 < lVar28) {
                    lVar28 = lVar28 + 1;
                    pEVar29 = iVar19.i + 2;
                    do {
                      iVar22.i = pEVar29;
                      if (((QString *)iVar22.i[-2].name.d.size == (QString *)qVar17) &&
                         (lhs_01.m_size = (qsizetype)pQVar25,
                         lhs_01.m_data = (storage_type_conflict *)qVar17, rhs_01.m_size = qVar15,
                         rhs_01.m_data = (storage_type_conflict *)qVar17,
                         bVar10 = QtPrivate::equalStrings
                                            ((QtPrivate *)iVar22.i[-2].name.d.ptr,lhs_01,rhs_01),
                         bVar10)) {
                        iVar22.i = iVar22.i + -2;
                        goto LAB_0010a449;
                      }
                      if (((QString *)iVar22.i[-1].name.d.size == (QString *)qVar17) &&
                         (lhs_02.m_size = (qsizetype)pQVar25,
                         lhs_02.m_data = (storage_type_conflict *)qVar17, rhs_02.m_size = qVar15,
                         rhs_02.m_data = (storage_type_conflict *)qVar17,
                         bVar10 = QtPrivate::equalStrings
                                            ((QtPrivate *)iVar22.i[-1].name.d.ptr,lhs_02,rhs_02),
                         bVar10)) {
                        iVar22.i = iVar22.i + -1;
                        goto LAB_0010a449;
                      }
                      if (((QString *)((iVar22.i)->name).d.size == (QString *)qVar17) &&
                         (lhs_03.m_size = (qsizetype)pQVar25,
                         lhs_03.m_data = (storage_type_conflict *)qVar17, rhs_03.m_size = qVar15,
                         rhs_03.m_data = (storage_type_conflict *)qVar17,
                         bVar10 = QtPrivate::equalStrings
                                            ((QtPrivate *)((iVar22.i)->name).d.ptr,lhs_03,rhs_03),
                         bVar10)) goto LAB_0010a449;
                      if (((QString *)iVar22.i[1].name.d.size == (QString *)qVar17) &&
                         (lhs_04.m_size = (qsizetype)pQVar25,
                         lhs_04.m_data = (storage_type_conflict *)qVar17, rhs_04.m_size = qVar15,
                         rhs_04.m_data = (storage_type_conflict *)qVar17,
                         bVar10 = QtPrivate::equalStrings
                                            ((QtPrivate *)iVar22.i[1].name.d.ptr,lhs_04,rhs_04),
                         bVar10)) {
                        iVar22.i = iVar22.i + 1;
                        goto LAB_0010a449;
                      }
                      lVar28 = lVar28 + -1;
                      lVar23 = lVar23 + -0xe0;
                      pEVar29 = iVar22.i + 4;
                    } while (1 < lVar28);
                    iVar19.i = iVar22.i + 2;
                  }
                  lVar28 = (lVar23 >> 3) * 0x6db6db6db6db6db7;
                  if (lVar28 == 1) {
LAB_0010a3f3:
                    if (((QString *)((iVar19.i)->name).d.size != (QString *)qVar17) ||
                       (lhs_07.m_size = (qsizetype)pQVar25,
                       lhs_07.m_data = (storage_type_conflict *)qVar17, rhs_07.m_size = qVar15,
                       rhs_07.m_data = (storage_type_conflict *)qVar17,
                       bVar10 = QtPrivate::equalStrings
                                          ((QtPrivate *)((iVar19.i)->name).d.ptr,lhs_07,rhs_07),
                       iVar22.i = iVar19.i, !bVar10)) {
                      iVar22 = iVar20;
                    }
                  }
                  else if (lVar28 == 2) {
LAB_0010a3c7:
                    if (((QString *)((iVar19.i)->name).d.size != (QString *)qVar17) ||
                       (lhs_06.m_size = (qsizetype)pQVar25,
                       lhs_06.m_data = (storage_type_conflict *)qVar17, rhs_06.m_size = qVar15,
                       rhs_06.m_data = (storage_type_conflict *)qVar17,
                       bVar10 = QtPrivate::equalStrings
                                          ((QtPrivate *)((iVar19.i)->name).d.ptr,lhs_06,rhs_06),
                       iVar22.i = iVar19.i, !bVar10)) {
                      iVar19.i = iVar19.i + 1;
                      goto LAB_0010a3f3;
                    }
                  }
                  else {
                    iVar22 = iVar20;
                    if ((lVar28 == 3) &&
                       (((QString *)((iVar19.i)->name).d.size != (QString *)qVar17 ||
                        (lhs_05.m_size = (qsizetype)pQVar25,
                        lhs_05.m_data = (storage_type_conflict *)qVar17, rhs_05.m_size = qVar15,
                        rhs_05.m_data = (storage_type_conflict *)qVar17,
                        bVar10 = QtPrivate::equalStrings
                                           ((QtPrivate *)((iVar19.i)->name).d.ptr,lhs_05,rhs_05),
                        iVar22.i = iVar19.i, !bVar10)))) {
                      iVar19.i = iVar19.i + 1;
                      goto LAB_0010a3c7;
                    }
                  }
LAB_0010a449:
                  iVar19 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1e8);
                  if (iVar22.i != iVar19.i) {
                    iVar12 = (iVar22.i)->value;
                    goto LAB_0010a46e;
                  }
                }
                if ((Function *)local_98.d != (Function *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d == 0) {
                    QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
                  }
                }
              }
              if ((QArrayData *)local_78._24_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_78._24_8_,2,0x10);
                }
              }
              if ((Function *)local_78._0_8_ != (Function *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_78._0_8_)->d).d =
                     *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
                }
              }
              aVar27.m_data = aVar27.m_data + 0x18;
            } while ((Parser *)aVar27.m_data != pPVar26);
            if (1 < (ulong)local_168.size) {
              local_280 = 0;
LAB_0010a6ff:
              iVar19 = QList<EnumNameValue>::begin((QList<EnumNameValue> *)&local_1e8);
              iVar20 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1e8);
              if (iVar19.i != iVar20.i) {
                lVar28 = local_280 * 2 + 1;
                do {
                  pQVar21 = QList<QString>::data((QList<QString> *)&local_168);
                  psVar1 = (storage_type_conflict *)((iVar19.i)->name).d.size;
                  if ((psVar1 == (storage_type_conflict *)pQVar21[local_280 * 2].d.size) &&
                     (lhs_08.m_size = (qsizetype)pQVar21[local_280 * 2].d.ptr,
                     lhs_08.m_data = psVar1, rhs_08.m_size = qVar15, rhs_08.m_data = psVar1,
                     bVar10 = QtPrivate::equalStrings
                                        ((QtPrivate *)((iVar19.i)->name).d.ptr,lhs_08,rhs_08),
                     bVar10)) {
                    pQVar21 = QList<QString>::data((QList<QString> *)&local_168);
                    data_00 = &(pQVar21[lVar28].d.d)->super_QArrayData;
                    pcVar2 = pQVar21[lVar28].d.ptr;
                    psVar1 = (storage_type_conflict *)pQVar21[lVar28].d.size;
                    if (data_00 != (QArrayData *)0x0) {
                      LOCK();
                      (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
                           (data_00->ref_)._q_value.super___atomic_base<int>._M_i + 1;
                      UNLOCK();
                    }
                    iVar20 = QList<EnumNameValue>::begin((QList<EnumNameValue> *)&local_1e8);
                    iVar22 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1e8);
                    lVar23 = (long)iVar22.i - (long)iVar20.i;
                    lVar28 = (lVar23 >> 3) * 0x6db6db6db6db6db7 >> 2;
                    if (lVar28 < 1) goto LAB_0010a898;
                    lVar28 = lVar28 + 1;
                    pEVar29 = iVar20.i + 2;
                    goto LAB_0010a7f9;
                  }
                  iVar19.i = iVar19.i + 1;
                } while (iVar19.i != iVar20.i);
              }
              parseMetadata();
              goto LAB_0010ab09;
            }
LAB_0010a53c:
            iVar19 = QList<EnumNameValue>::begin((QList<EnumNameValue> *)&local_1e8);
            iVar20 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1e8);
            if (iVar19.i != iVar20.i) {
              uVar13 = ((long)iVar20.i - (long)iVar19.i >> 3) * 0x6db6db6db6db6db7;
              lVar28 = 0x3f;
              if (uVar13 != 0) {
                for (; uVar13 >> lVar28 == 0; lVar28 = lVar28 + -1) {
                }
              }
              std::
              __introsort_loop<QList<EnumNameValue>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<Parser::parseMetadata(QString_const&,long_long,QList<QString>const&)::__1>>
                        (iVar19.i,iVar20.i,((uint)lVar28 ^ 0x3f) * 2 ^ 0x7e);
              if ((long)iVar20.i - (long)iVar19.i < 0x381) {
                std::
                __insertion_sort<QList<EnumNameValue>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<Parser::parseMetadata(QString_const&,long_long,QList<QString>const&)::__1>>
                          (iVar19.i,iVar20.i);
              }
              else {
                pEVar29 = iVar19.i + 0x10;
                std::
                __insertion_sort<QList<EnumNameValue>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<Parser::parseMetadata(QString_const&,long_long,QList<QString>const&)::__1>>
                          (iVar19.i,pEVar29);
                for (; pEVar29 != iVar20.i; pEVar29 = pEVar29 + 1) {
                  std::
                  __unguarded_linear_insert<QList<EnumNameValue>::iterator,__gnu_cxx::__ops::_Val_comp_iter<Parser::parseMetadata(QString_const&,long_long,QList<QString>const&)::__1>>
                            (pEVar29);
                }
              }
            }
            QList<QString>::clear((QList<QString> *)&local_1c8);
            if (local_1e8.size != 0) {
              iVar11 = (local_1e8.ptr)->value;
              pQVar25 = &(local_1e8.ptr)->valueStr;
              lVar28 = local_1e8.size * 0x38;
              do {
                local_78._0_8_ = (Function *)0x0;
                local_78._8_8_ = (Parser *)0x0;
                local_78._16_8_ = (QString *)0x0;
                if ((pQVar25->d).ptr == (char16_t *)0x0) {
                  if (*(int *)(pQVar25 + 1) == iVar11 + 1 && bVar9 == false) {
                    QString::operator=((QString *)local_78,(QString *)(pQVar25 + -1));
                  }
                  else {
                    local_200.d.d = (Data *)0x0;
                    local_200.d.ptr = L"%1 = %2";
                    local_200.d.size = 7;
                    a_00.m_size = (((EnumNameValue *)(pQVar25 + -1))->name).d.size * 4 + 2;
                    a_00.field_0.m_data_utf16 = (((EnumNameValue *)(pQVar25 + -1))->name).d.ptr;
                    QString::arg_impl((QString *)(local_130 + 0x78),&local_200,a_00,0,(QChar)0x20);
                    QString::arg_impl((QString *)(local_130 + 0x98),(QString *)(local_130 + 0x78),
                                      (long)*(int *)(pQVar25 + 1),0,10,(QChar)0x20);
                    uVar4 = local_78._8_8_;
                    uVar3 = local_78._0_8_;
                    qVar15 = local_98.size;
                    pDVar5 = local_98.d;
                    local_98.d = (Data *)local_78._0_8_;
                    local_78._0_8_ = pDVar5;
                    local_78._8_8_ = local_98.ptr;
                    local_98.ptr = (QString *)uVar4;
                    local_98.size = local_78._16_8_;
                    local_78._16_8_ = qVar15;
                    if ((Function *)uVar3 != (Function *)0x0) {
                      LOCK();
                      *(int *)&(((QString *)uVar3)->d).d = *(int *)&(((QString *)uVar3)->d).d + -1;
                      UNLOCK();
                      if (*(int *)&(((QString *)uVar3)->d).d == 0) {
                        QArrayData::deallocate((QArrayData *)uVar3,2,0x10);
                      }
                    }
                    if ((Function *)local_130._120_8_ != (Function *)0x0) {
                      LOCK();
                      *(int *)&(((QString *)local_130._120_8_)->d).d =
                           *(int *)&(((QString *)local_130._120_8_)->d).d + -1;
                      UNLOCK();
                      if (*(int *)&(((QString *)local_130._120_8_)->d).d == 0) {
                        QArrayData::deallocate((QArrayData *)local_130._120_8_,2,0x10);
                      }
                    }
                    if (&(local_200.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_200.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_200.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_200.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_200.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                  }
                  iVar11 = *(int *)(pQVar25 + 1);
                }
                else {
                  QString::operator=((QString *)local_78,pQVar25);
                }
                QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                          ((QMovableArrayOps<QString> *)&local_1c8,local_1c8.size,
                           (QString *)local_78);
                QList<QString>::end((QList<QString> *)&local_1c8);
                if ((Function *)local_78._0_8_ != (Function *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_78._0_8_)->d).d =
                       *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
                  }
                }
                pQVar25 = (QString *)&pQVar25[2].d.ptr;
                lVar28 = lVar28 + -0x38;
              } while (lVar28 != 0);
            }
            local_200.d.d = (Data *)0x0;
            local_200.d.ptr = L"%1 {\n %2 \n} %3;";
            local_200.d.size = 0xf;
            a_01.m_size = local_188.d.size * 4 + 2;
            a_01.field_0.m_data_utf16 = local_188.d.ptr;
            QString::arg_impl((QString *)(local_130 + 0x78),&local_200,a_01,0,(QChar)0x20);
            QtPrivate::QStringList_join(local_248,(QStringList *)&local_1c8,(QChar *)L",\n",2);
            a_02.m_size = local_248[0].d.size * 4 + 2;
            a_02.field_0.m_data_utf16 = local_248[0].d.ptr;
            QString::arg_impl((QString *)(local_130 + 0x98),(QString *)(local_130 + 0x78),a_02,0,
                              (QChar)0x20);
            qVar15 = 0;
            a_03.m_size = local_1a8.d.size * 4 + 2;
            a_03.field_0.m_data_utf16 = local_1a8.d.ptr;
            QString::arg_impl((QString *)local_78,(QString *)(local_130 + 0x98),a_03,0,(QChar)0x20);
            uVar8 = local_78._16_8_;
            uVar7 = local_78._0_8_;
            uVar4 = local_130._96_8_;
            uVar3 = local_130._88_8_;
            local_78._0_8_ = local_130._88_8_;
            local_130._88_8_ = uVar7;
            local_130._96_8_ = local_78._8_8_;
            local_78._8_8_ = uVar4;
            local_78._16_8_ = local_130._104_8_;
            local_130._104_8_ = uVar8;
            if ((Function *)uVar3 != (Function *)0x0) {
              LOCK();
              *(int *)&(((QString *)uVar3)->d).d = *(int *)&(((QString *)uVar3)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)uVar3)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)uVar3,2,0x10);
              }
            }
            if ((Function *)local_98.d != (Function *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_248[0].d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_248[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_248[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if (((local_248[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate(&(local_248[0].d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((Function *)local_130._120_8_ != (Function *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_130._120_8_)->d).d =
                   *(int *)&(((QString *)local_130._120_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_130._120_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_130._120_8_,2,0x10);
              }
            }
            if (&(local_200.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_200.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_200.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_200.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_200.d.d)->super_QArrayData,2,0x10);
              }
            }
            str_02.m_size = 1;
            str_02.m_data = (storage_type_conflict *)local_130._104_8_;
            bVar9 = QtPrivate::QStringList_contains
                              ((QtPrivate *)this_01,(QStringList *)local_130._96_8_,str_02,
                               (CaseSensitivity)qVar15);
            if (!bVar9) {
              QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                        ((QMovableArrayOps<QString> *)this_01,(this->m_metadata).d.size,
                         (QString *)(local_130 + 0x58));
              QList<QString>::end(this_01);
            }
            QArrayDataPointer<EnumNameValue>::~QArrayDataPointer(&local_1e8);
          }
          QArrayDataPointer<QString>::~QArrayDataPointer(&local_1c8);
          if ((Function *)local_1a8.d.d != (Function *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_1a8.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_1a8.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_1a8.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
            }
          }
          QArrayDataPointer<QString>::~QArrayDataPointer(&local_168);
        }
        else {
          local_78._0_8_ = (Function *)0x0;
          local_78._8_8_ = L"AUTO";
          local_78._16_8_ = (QString *)0x4;
          bVar9 = QString::startsWith(&local_148,(QString *)local_78,CaseSensitive);
          if ((Function *)local_78._0_8_ != (Function *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_78._0_8_)->d).d =
                 *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
            }
          }
          if (bVar9) goto LAB_00109b73;
          QRegularExpressionMatch::captured
                    ((QString *)local_78,(QRegularExpressionMatch *)local_130,0);
          str_01.m_size = 1;
          str_01.m_data = (storage_type_conflict *)local_78._16_8_;
          bVar9 = QtPrivate::QStringList_contains
                            ((QtPrivate *)this_01,(QStringList *)local_78._8_8_,str_01,
                             (CaseSensitivity)qVar15);
          if ((Function *)local_78._0_8_ != (Function *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_78._0_8_)->d).d =
                 *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
            }
          }
          if (!bVar9) {
            QRegularExpressionMatch::captured
                      ((QString *)local_78,(QRegularExpressionMatch *)local_130,0);
            QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                      ((QMovableArrayOps<QString> *)this_01,(this->m_metadata).d.size,
                       (QString *)local_78);
            QList<QString>::end(this_01);
            if ((Function *)local_78._0_8_ != (Function *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_78._0_8_)->d).d =
                   *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
              }
            }
          }
        }
        if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,0x10);
          }
        }
        lVar28 = qVar16 + 1;
        QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)local_130);
        bVar9 = QRegularExpressionMatchIterator::hasNext
                          ((QRegularExpressionMatchIterator *)(local_130 + 8));
      } while (bVar9);
    }
    if (local_130._40_8_ - lVar28 != 0 && lVar28 <= (long)local_130._40_8_) {
      QString::mid((QString *)local_78,(QString *)(local_130 + 0x18),lVar28,
                   local_130._40_8_ - lVar28);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&this->m_metadata,(this->m_metadata).d.size,
                 (QString *)local_78);
      QList<QString>::end(&this->m_metadata);
      if ((Function *)local_78._0_8_ != (Function *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_78._0_8_)->d).d =
             *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
    }
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
              ((QRegularExpressionMatchIterator *)(local_130 + 8));
    QRegularExpression::~QRegularExpression((QRegularExpression *)(local_130 + 0x10));
    if ((QArrayData *)local_130._24_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_130._24_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_130._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_130._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_130._24_8_,2,0x10);
      }
    }
  }
  if ((Replace *)local_130._56_8_ != (Replace *)0x0) {
    LOCK();
    ((__atomic_base<int> *)&(((QString *)local_130._56_8_)->d).d)->_M_i =
         ((__atomic_base<int> *)&(((QString *)local_130._56_8_)->d).d)->_M_i + -1;
    UNLOCK();
    if (((__atomic_base<int> *)&(((QString *)local_130._56_8_)->d).d)->_M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_130._56_8_,2,0x10);
    }
  }
  if ((Function *)local_130._88_8_ != (Function *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_130._88_8_)->d).d =
         *(int *)&(((QString *)local_130._88_8_)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_130._88_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_130._88_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
  while( true ) {
    if (((storage_type_conflict *)iVar24.i[-1].name.d.size == psVar1) &&
       (lhs_10.m_size = (qsizetype)pcVar2, lhs_10.m_data = psVar1, rhs_10.m_size = qVar15,
       rhs_10.m_data = psVar1,
       bVar10 = QtPrivate::equalStrings((QtPrivate *)iVar24.i[-1].name.d.ptr,lhs_10,rhs_10), bVar10)
       ) {
      iVar24.i = iVar24.i + -1;
      goto LAB_0010a95a;
    }
    if (((storage_type_conflict *)((iVar24.i)->name).d.size == psVar1) &&
       (lhs_11.m_size = (qsizetype)pcVar2, lhs_11.m_data = psVar1, rhs_11.m_size = qVar15,
       rhs_11.m_data = psVar1,
       bVar10 = QtPrivate::equalStrings((QtPrivate *)((iVar24.i)->name).d.ptr,lhs_11,rhs_11), bVar10
       )) goto LAB_0010a95a;
    if (((storage_type_conflict *)iVar24.i[1].name.d.size == psVar1) &&
       (lhs_12.m_size = (qsizetype)pcVar2, lhs_12.m_data = psVar1, rhs_12.m_size = qVar15,
       rhs_12.m_data = psVar1,
       bVar10 = QtPrivate::equalStrings((QtPrivate *)iVar24.i[1].name.d.ptr,lhs_12,rhs_12), bVar10))
    {
      iVar24.i = iVar24.i + 1;
      goto LAB_0010a95a;
    }
    lVar28 = lVar28 + -1;
    lVar23 = lVar23 + -0xe0;
    pEVar29 = iVar24.i + 4;
    if (lVar28 < 2) break;
LAB_0010a7f9:
    iVar24.i = pEVar29;
    if (((storage_type_conflict *)iVar24.i[-2].name.d.size == psVar1) &&
       (lhs_09.m_size = (qsizetype)pcVar2, lhs_09.m_data = psVar1, rhs_09.m_size = qVar15,
       rhs_09.m_data = psVar1,
       bVar10 = QtPrivate::equalStrings((QtPrivate *)iVar24.i[-2].name.d.ptr,lhs_09,rhs_09), bVar10)
       ) {
      iVar24.i = iVar24.i + -2;
      goto LAB_0010a95a;
    }
  }
  iVar20.i = iVar24.i + 2;
LAB_0010a898:
  lVar28 = (lVar23 >> 3) * 0x6db6db6db6db6db7;
  if (lVar28 != 1) {
    if (lVar28 != 2) {
      iVar24 = iVar22;
      if ((lVar28 != 3) ||
         (((storage_type_conflict *)((iVar20.i)->name).d.size == psVar1 &&
          (lhs_13.m_size = (qsizetype)pcVar2, lhs_13.m_data = psVar1, rhs_13.m_size = qVar15,
          rhs_13.m_data = psVar1,
          bVar10 = QtPrivate::equalStrings((QtPrivate *)((iVar20.i)->name).d.ptr,lhs_13,rhs_13),
          iVar24.i = iVar20.i, bVar10)))) goto LAB_0010a95a;
      iVar20.i = iVar20.i + 1;
    }
    if (((storage_type_conflict *)((iVar20.i)->name).d.size == psVar1) &&
       (lhs_14.m_size = (qsizetype)pcVar2, lhs_14.m_data = psVar1, rhs_14.m_size = qVar15,
       rhs_14.m_data = psVar1,
       bVar10 = QtPrivate::equalStrings((QtPrivate *)((iVar20.i)->name).d.ptr,lhs_14,rhs_14),
       iVar24.i = iVar20.i, bVar10)) goto LAB_0010a95a;
    iVar20.i = iVar20.i + 1;
  }
  if (((storage_type_conflict *)((iVar20.i)->name).d.size != psVar1) ||
     (lhs_15.m_size = (qsizetype)pcVar2, lhs_15.m_data = psVar1, rhs_15.m_size = qVar15,
     rhs_15.m_data = psVar1,
     bVar10 = QtPrivate::equalStrings((QtPrivate *)((iVar20.i)->name).d.ptr,lhs_15,rhs_15),
     iVar24.i = iVar20.i, !bVar10)) {
    iVar24 = iVar22;
  }
LAB_0010a95a:
  iVar20 = QList<EnumNameValue>::end((QList<EnumNameValue> *)&local_1e8);
  if (iVar24.i == iVar20.i) {
    parseMetadata();
  }
  else {
    local_200.d.d = (Data *)0x0;
    local_200.d.ptr = L"RANGE(%1, %2 ... %3)";
    local_200.d.size = 0x14;
    a.m_size = ((iVar19.i)->name).d.size * 4 + 2;
    a.field_0.m_data_utf16 = ((iVar19.i)->name).d.ptr;
    QString::arg_impl((QString *)(local_130 + 0x78),&local_200,a,0,(QChar)0x20);
    QString::arg_impl((QString *)(local_130 + 0x98),(QString *)(local_130 + 0x78),
                      (long)(iVar19.i)->value,0,10,(QChar)0x20);
    qVar15 = 10;
    QString::arg_impl((QString *)local_78,(QString *)(local_130 + 0x98),(long)(iVar24.i)->value,0,10
                      ,(QChar)0x20);
    data_01 = (Function *)((iVar19.i)->valueStr).d.d;
    aVar27 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)((iVar19.i)->valueStr).d.ptr;
    ((iVar19.i)->valueStr).d.d = (Data *)local_78._0_8_;
    ((iVar19.i)->valueStr).d.ptr = (char16_t *)local_78._8_8_;
    pQVar25 = (QString *)((iVar19.i)->valueStr).d.size;
    ((iVar19.i)->valueStr).d.size = local_78._16_8_;
    local_78._0_8_ = data_01;
    local_78._8_8_ = aVar27;
    local_78._16_8_ = pQVar25;
    if (data_01 != (Function *)0x0) {
      LOCK();
      ((__atomic_base<int> *)&(data_01->className).d.d)->_M_i =
           ((__atomic_base<int> *)&(data_01->className).d.d)->_M_i + -1;
      UNLOCK();
      if (((__atomic_base<int> *)&(data_01->className).d.d)->_M_i == 0) {
        QArrayData::deallocate((QArrayData *)data_01,2,0x10);
      }
    }
    if ((Function *)local_98.d != (Function *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_98.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
      }
    }
    if ((Function *)local_130._120_8_ != (Function *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_130._120_8_)->d).d =
           *(int *)&(((QString *)local_130._120_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_130._120_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_130._120_8_,2,0x10);
      }
    }
    if (&(local_200.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_200.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_200.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_200.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_200.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (data_00 != (QArrayData *)0x0) {
    LOCK();
    (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
         (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data_00,2,0x10);
    }
  }
LAB_0010ab09:
  local_280 = local_280 + 1;
  if ((ulong)local_168.size >> 1 <= local_280) goto LAB_0010a53c;
  goto LAB_0010a6ff;
}

Assistant:

void Parser::parseMetadata(const QString &data, qsizetype offset, const QStringList &includes)
{
    qsizetype beginOfProvider = data.indexOf(QLatin1Char('('), offset);
    qsizetype endOfProvider = data.indexOf(QLatin1Char(','), beginOfProvider);
    QString metadata;
    QString provider = data.mid(beginOfProvider + 1, endOfProvider - beginOfProvider - 1).simplified();
    if (provider != m_provider)
        return;

    qsizetype endOfPoint = data.indexOf(QLatin1Char(')'), endOfProvider + 1);
    metadata = data.mid(endOfProvider + 1, endOfPoint - endOfProvider - 1).simplified();

    DEBUGPRINTF(printf("tracepointgen: metadata: %s", qPrintable(metadata)));

    QString preprocessed = preprocessMetadata(metadata);

    DEBUGPRINTF2(printf("preprocessed %s\n", qPrintable(preprocessed)));

    QRegularExpression macro(QStringLiteral("([A-Z]*) ?{ ?([A-Za-z0-9=_,. ]*) ?} ?([A-Za-z0-9_:]*) ?;"));
    QRegularExpressionMatchIterator i = macro.globalMatch(preprocessed);
    qsizetype prev = 0;
    while (i.hasNext()) {
        QRegularExpressionMatch match = i.next();
        QString values = match.captured(2).trimmed();
        int cur = match.capturedStart();
        if (cur > prev)
            m_metadata.append(preprocessed.mid(prev, cur - prev));

        prev = match.capturedEnd() + 1;
        DEBUGPRINTF2(printf("values: %s\n", qPrintable(values)));
        if (values.isEmpty() || values.startsWith(QStringLiteral("AUTO"))) {
            values.replace(QLatin1Char('\n'), QLatin1Char(' '));
            QStringList ranges;
            if (values.contains(QStringLiteral("RANGE"))) {
                QRegularExpression rangeMacro(QStringLiteral("RANGE +([A-Za-z0-9_]*) +... +([A-Za-z0-9_]*)"));
                QRegularExpressionMatchIterator r = rangeMacro.globalMatch(values);
                while (r.hasNext()) {
                    QRegularExpressionMatch rm = r.next();
                    ranges << rm.captured(1);
                    ranges << rm.captured(2);
                    DEBUGPRINTF2(printf("range: %s ... %s\n", qPrintable(rm.captured(1)), qPrintable(rm.captured(2))));
                }
            }

            const auto enumOrFlag = match.captured(1);
            const auto name = match.captured(3);
            const bool flags = enumOrFlag == QStringLiteral("FLAGS");

            QStringList values = findEnumValues(name, includes);
            if (values.isEmpty()) {
                if (flags && name.endsWith(QLatin1Char('s')))
                    values = findEnumValues(name.left(name.length() - 1), includes);
                if (values.isEmpty()) {
                    DEBUGPRINTF(printf("Unable to find values for %s\n", qPrintable(name)));
                }
            }
            if (!values.isEmpty()) {
                auto moreValues = enumsToValues(values);
                if (ranges.size()) {
                    for (int i = 0; i < ranges.size() / 2; i++) {
                        bool rangeFound = false;
                        for (auto &v : moreValues) {
                            if (v.name == ranges[2 * i]) {
                                rangeFound = true;
                                QString rangeEnd = ranges[2 * i + 1];
                                auto iter = std::find_if(moreValues.begin(), moreValues.end(), [&rangeEnd](const EnumNameValue &elem){
                                    return elem.name == rangeEnd;
                                });
                                if (iter != moreValues.end())
                                    v.valueStr = QStringLiteral("RANGE(%1, %2 ... %3)").arg(v.name).arg(v.value).arg(iter->value);
                                else
                                    panic("Unable to find range end: %s\n", qPrintable(rangeEnd));
                                break;
                            }
                        }
                        if (rangeFound == false)
                            panic("Unable to find range begin: %s\n", qPrintable(ranges[2 * i]));
                    }
                }
                std::sort(moreValues.begin(), moreValues.end(), [](const EnumNameValue &a, const EnumNameValue &b) {
                    return a.value < b.value;
                });
                values.clear();
                int prevValue = std::as_const(moreValues).front().value;
                for (const auto &v : std::as_const(moreValues)) {
                    QString a;
                    if (v.valueStr.isNull()) {
                        if (v.value == prevValue + 1 && !flags)
                            a = v.name;
                        else
                            a = QStringLiteral("%1 = %2").arg(v.name).arg(v.value);
                        prevValue = v.value;
                    } else {
                        a = v.valueStr;
                    }
                    values << a;
                }

                metadata = QStringLiteral("%1 {\n %2 \n} %3;").arg(enumOrFlag).arg(values.join(QStringLiteral(",\n"))).arg(name);
                if (!m_metadata.contains(metadata))
                    m_metadata.append(metadata);
            }
        } else {
            if (!m_metadata.contains(match.captured()))
                m_metadata.append(match.captured());
        }
    }
    if (prev < preprocessed.length())
        m_metadata.append(preprocessed.mid(prev, preprocessed.length() - prev));
}